

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroup::updateState
          (QSequentialAnimationGroup *this,State newState,State oldState)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  QSequentialAnimationGroupPrivate *this_01;
  QBindingStatus *pQVar1;
  State SVar2;
  
  this_01 = *(QSequentialAnimationGroupPrivate **)(this + 8);
  QAbstractAnimation::updateState((QAbstractAnimation *)this,newState,oldState);
  data = &this_01->currentAnimation;
  this_00 = &(this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
           super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar1 != (QBindingStatus *)0x0) &&
     (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation_*>).val == (QAbstractAnimation *)0x0) {
    return;
  }
  if (newState == Running) {
    pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    SVar2 = QAbstractAnimation::state
                      ((QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val);
    if ((oldState == Paused) && (SVar2 == Paused)) {
      pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
      }
      QAbstractAnimation::start
                ((QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val,
                 KeepWhenStopped);
      return;
    }
  }
  else {
    if (newState != Paused) {
      if (newState != Stopped) {
        return;
      }
      pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
      }
      QAbstractAnimation::stop
                ((QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val);
      return;
    }
    pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar1 != (QBindingStatus *)0x0) &&
       (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    SVar2 = QAbstractAnimation::state
                      ((QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val);
    if ((oldState == Running) && (SVar2 == Running)) {
      pQVar1 = (this_01->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
               super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
      if ((pQVar1 != (QBindingStatus *)0x0) &&
         (pQVar1->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
        QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
      }
      QAbstractAnimation::pause
                ((QAbstractAnimation *)(data->super_QPropertyData<QAbstractAnimation_*>).val);
      return;
    }
  }
  QSequentialAnimationGroupPrivate::restart(this_01);
  return;
}

Assistant:

void QSequentialAnimationGroup::updateState(QAbstractAnimation::State newState,
                                            QAbstractAnimation::State oldState)
{
    Q_D(QSequentialAnimationGroup);
    QAnimationGroup::updateState(newState, oldState);

    if (!d->currentAnimation)
        return;

    switch (newState) {
    case Stopped:
        d->currentAnimation->stop();
        break;
    case Paused:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Running) {
                d->currentAnimation->pause();
            }
        else
            d->restart();
        break;
    case Running:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Paused)
            d->currentAnimation->start();
        else
            d->restart();
        break;
    }
}